

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O3

void __thiscall duckdb::MiniZStreamWrapper::~MiniZStreamWrapper(MiniZStreamWrapper *this)

{
  _Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false> _Var1;
  char cVar2;
  
  (this->super_StreamWrapper)._vptr_StreamWrapper = (_func_int **)&PTR__MiniZStreamWrapper_01968748;
  cVar2 = ::std::uncaught_exception();
  if (cVar2 == '\0') {
    Close(this);
  }
  _Var1._M_head_impl =
       (this->mz_stream_ptr).
       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (mz_stream_s *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->mz_stream_ptr).
  super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>._M_t.
  super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
  .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl = (mz_stream_s *)0x0;
  return;
}

Assistant:

MiniZStreamWrapper::~MiniZStreamWrapper() {
	// avoid closing if destroyed during stack unwinding
	if (Exception::UncaughtException()) {
		return;
	}
	try {
		MiniZStreamWrapper::Close();
	} catch (...) { // NOLINT - cannot throw in exception
	}
}